

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare::operator()
          (SymbolCompare *this,StringPiece *lhs,SymbolEntry *rhs)

{
  StringPiece y;
  StringPiece x;
  size_type sVar1;
  size_type sVar2;
  size_type extraout_RDX;
  StringPiece str;
  string local_118;
  StringPiece local_f8;
  SymbolCompare *local_e8;
  char *pcStack_e0;
  StringPiece local_d0;
  size_type local_c0;
  char *local_b8;
  size_type local_b0;
  char *local_a8;
  StringPiece local_a0;
  StringPiece local_90;
  int local_7c;
  undefined1 local_78 [4];
  int res;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  rhs_parts;
  undefined1 local_48 [8];
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  lhs_parts;
  SymbolEntry *rhs_local;
  StringPiece *lhs_local;
  SymbolCompare *this_local;
  
  rhs_parts.second.length_ = (size_type)lhs->ptr_;
  lhs_parts.second.length_ = (size_type)rhs;
  GetParts((pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
            *)local_48,this,*lhs);
  GetParts((pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
            *)local_78,this,(SymbolEntry *)lhs_parts.second.length_);
  sVar1 = stringpiece_internal::StringPiece::size((StringPiece *)local_78);
  local_90 = stringpiece_internal::StringPiece::substr((StringPiece *)local_48,0,sVar1);
  sVar1 = stringpiece_internal::StringPiece::size((StringPiece *)local_48);
  local_a0 = stringpiece_internal::StringPiece::substr((StringPiece *)local_78,0,sVar1);
  local_7c = stringpiece_internal::StringPiece::compare(&local_90,local_a0);
  if (local_7c == 0) {
    sVar1 = stringpiece_internal::StringPiece::size((StringPiece *)local_48);
    sVar2 = stringpiece_internal::StringPiece::size((StringPiece *)local_78);
    if (sVar1 == sVar2) {
      local_b0 = lhs_parts.first.length_;
      local_a8 = lhs_parts.second.ptr_;
      local_c0 = rhs_parts.first.length_;
      local_b8 = rhs_parts.second.ptr_;
      x.length_ = (size_type)lhs_parts.second.ptr_;
      x.ptr_ = (char *)lhs_parts.first.length_;
      y.length_ = (size_type)rhs_parts.second.ptr_;
      y.ptr_ = (char *)rhs_parts.first.length_;
      this_local._7_1_ = stringpiece_internal::operator<(x,y);
    }
    else {
      local_e8 = (SymbolCompare *)lhs->ptr_;
      pcStack_e0 = (char *)lhs->length_;
      str.length_ = extraout_RDX;
      str.ptr_ = pcStack_e0;
      local_d0 = AsString(local_e8,str);
      AsString_abi_cxx11_(&local_118,this,(SymbolEntry *)lhs_parts.second.length_);
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_f8,&local_118);
      this_local._7_1_ = stringpiece_internal::operator<(local_d0,local_f8);
      std::__cxx11::string::~string((string *)&local_118);
    }
  }
  else {
    this_local._7_1_ = local_7c < 0;
  }
  return this_local._7_1_;
}

Assistant:

bool operator()(const T& lhs, const U& rhs) const {
      auto lhs_parts = GetParts(lhs);
      auto rhs_parts = GetParts(rhs);

      // Fast path to avoid making the whole string for common cases.
      if (int res =
              lhs_parts.first.substr(0, rhs_parts.first.size())
                  .compare(rhs_parts.first.substr(0, lhs_parts.first.size()))) {
        // If the packages already differ, exit early.
        return res < 0;
      } else if (lhs_parts.first.size() == rhs_parts.first.size()) {
        return lhs_parts.second < rhs_parts.second;
      }
      return AsString(lhs) < AsString(rhs);
    }